

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_s2c_opening_serialize
              (secp256k1_context *ctx,uchar *output33,secp256k1_ecdsa_s2c_opening *opening)

{
  int iVar1;
  size_t out_len;
  size_t local_8;
  
  local_8 = 0x21;
  if (output33 == (uchar *)0x0) {
    secp256k1_ecdsa_s2c_opening_serialize_cold_2();
  }
  else {
    if (opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
      iVar1 = secp256k1_ec_pubkey_serialize
                        (ctx,output33,&local_8,(secp256k1_pubkey_conflict *)opening,0x102);
      return iVar1;
    }
    secp256k1_ecdsa_s2c_opening_serialize_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_opening_serialize(const secp256k1_context* ctx, unsigned char* output33, const secp256k1_ecdsa_s2c_opening* opening) {
    size_t out_len = 33;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output33 != NULL);
    ARG_CHECK(opening != NULL);
    return secp256k1_ec_pubkey_serialize(ctx, output33, &out_len, (const secp256k1_pubkey*) opening, SECP256K1_EC_COMPRESSED);
}